

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

vec4 dja::lerp(float_t u,vec4 *a,vec4 *b)

{
  vec4 vVar1;
  
  vVar1.x = (b->x - a->x) * u + a->x;
  vVar1.y = (b->y - a->y) * u + a->y;
  vVar1.z = (b->z - a->z) * u + a->z;
  vVar1.w = b->w * a->w * u * a->w;
  return vVar1;
}

Assistant:

V4 lerp(const V1 u, const V4& a, const V4& b) {return a + u * (b - a);}